

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Signature2.cpp
# Opt level: O1

void __thiscall
adios2::core::callback::Signature2::Signature2
          (Signature2 *this,
          function<void_(void_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_long,_const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&,_const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&,_const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&)>
          *function,Params *parameters)

{
  string local_68;
  string local_48;
  
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"Signature2","");
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"callback","");
  Operator::Operator(&this->super_Operator,&local_48,CALLBACK_SIGNATURE2,&local_68,parameters);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  (this->super_Operator)._vptr_Operator = (_func_int **)&PTR__Signature2_0087cc30;
  std::
  function<void_(void_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_long,_const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&,_const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&,_const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&)>
  ::function(&this->m_Function,function);
  return;
}

Assistant:

Signature2::Signature2(
    const std::function<void(void *, const std::string &, const std::string &, const std::string &,
                             const size_t, const Dims &, const Dims &, const Dims &)> &function,
    const Params &parameters)
: Operator("Signature2", Operator::CALLBACK_SIGNATURE2, "callback", parameters),
  m_Function(function)
{
}